

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.c
# Opt level: O3

void transfer_lights(level *oldlev,level *newlev,uint obj_id)

{
  boolean bVar1;
  ls_t *plVar2;
  ls_t *plVar3;
  ls_t *plVar4;
  
  if ((newlev != oldlev) && (plVar2 = oldlev->lev_lights, plVar2 != (ls_t *)0x0)) {
    plVar3 = (ls_t *)&oldlev->lev_lights;
    do {
      plVar4 = plVar2;
      if (plVar2->type == 1) {
        if ((obj_id == 0) && (*(char *)((long)plVar2->id + 0x4f) < '\x01')) goto LAB_001b479f;
      }
      else if (plVar2->type == 0) {
        if (obj_id == 0) {
          bVar1 = obj_is_local((obj *)plVar2->id);
          if (bVar1 == '\0') goto LAB_001b479f;
          plVar4 = plVar3->next;
        }
        else if (((obj *)plVar2->id)->o_id == obj_id) {
LAB_001b479f:
          plVar3->next = plVar2->next;
          plVar2->next = newlev->lev_lights;
          newlev->lev_lights = plVar2;
          plVar4 = plVar3;
        }
      }
      plVar2 = plVar4->next;
      plVar3 = plVar4;
    } while (plVar2 != (ls_t *)0x0);
  }
  return;
}

Assistant:

void transfer_lights(struct level *oldlev, struct level *newlev, unsigned int obj_id)
{
    light_source **prev, *curr;
    boolean transfer;

    if (newlev == oldlev)
	return;

    for (prev = &oldlev->lev_lights; (curr = *prev) != 0; ) {
	switch (curr->type) {
	    case LS_OBJECT:
		if (obj_id)
		    transfer = (((struct obj *)curr->id)->o_id == obj_id);
		else
		    transfer = !obj_is_local((struct obj *)curr->id);
		break;
	    case LS_MONSTER:
		if (obj_id)
		    transfer = FALSE;
		else
		    transfer = !mon_is_local((struct monst *)curr->id);
		break;
	    default:
		transfer = FALSE;
		break;
	}
	/* associate light sources with the new level */
	if (transfer) {
	    *prev = curr->next;
	    curr->next = newlev->lev_lights;
	    newlev->lev_lights = curr;
	} else {
	    prev = &(*prev)->next;
	}
    }
}